

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_light.cpp
# Opt level: O0

Light_EvalRes * embree::PointLight_eval(Light *super,DifferentialGeometry *dg,Vec3fa *dir)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 *in_RCX;
  long in_RDX;
  long in_RSI;
  Light_EvalRes *in_RDI;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  float invdist;
  float cosTheta;
  float sinTheta2;
  float t_far;
  float t_near;
  float radical;
  float c;
  float centerDist2;
  float b;
  float a;
  Vec3fa A;
  PointLight *self;
  Light_EvalRes *res;
  __m128 r_1;
  __m128 a_5;
  __m128 r;
  __m128 a_4;
  vfloat4 c_1;
  vfloat4 b_1;
  vfloat4 a_1;
  vfloat4 c_2;
  vfloat4 b_2;
  vfloat4 a_2;
  vfloat4 c_3;
  vfloat4 b_3;
  vfloat4 a_3;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  long local_c08;
  undefined8 *local_c00;
  long local_bf8;
  undefined8 *local_be0;
  undefined8 *local_bd8;
  undefined8 *local_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 *local_bb8;
  undefined8 *local_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 *local_b98;
  undefined8 *local_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 *local_b78;
  undefined8 *local_b70;
  undefined8 *local_b00;
  undefined1 *local_af0;
  float local_ae0;
  float local_adc;
  float local_ad8;
  float local_ad4;
  float local_ad0;
  float local_acc;
  undefined1 local_a98 [16];
  ulong local_a88;
  undefined8 uStack_a80;
  float local_a78;
  undefined4 local_a54;
  undefined8 *local_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  float local_a28;
  float fStack_a24;
  float fStack_a20;
  float fStack_a1c;
  undefined8 *local_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 *local_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 *local_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 *local_8f8;
  undefined8 *local_890;
  undefined8 *local_888;
  undefined8 *local_880;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  undefined8 *local_868;
  undefined8 *local_860;
  undefined8 *local_858;
  undefined8 *local_850;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  undefined8 *local_838;
  undefined8 *local_830;
  undefined8 *local_828;
  undefined8 *local_820;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  undefined8 *local_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 *local_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 *local_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 *local_7a0;
  undefined8 *local_798;
  undefined8 *local_790;
  undefined8 *local_788;
  undefined8 *local_780;
  undefined8 *local_778;
  undefined8 *local_770;
  undefined8 *local_768;
  undefined8 *local_760;
  undefined8 *local_758;
  undefined8 *local_750;
  undefined8 *local_748;
  undefined8 *local_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 *local_6e0;
  undefined8 *local_6d8;
  undefined8 *local_6d0;
  float local_6c8;
  float fStack_6c4;
  float fStack_6c0;
  float fStack_6bc;
  undefined8 *local_6b8;
  undefined8 *local_6b0;
  undefined8 *local_6a8;
  undefined8 *local_6a0;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  undefined8 *local_688;
  undefined8 *local_680;
  undefined8 *local_678;
  undefined8 *local_670;
  float local_668;
  float fStack_664;
  float fStack_660;
  float fStack_65c;
  undefined8 *local_658;
  undefined8 *local_650;
  undefined8 *local_648;
  undefined8 *local_640;
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  undefined8 *local_628;
  undefined8 *local_620;
  undefined8 *local_618;
  undefined8 *local_610;
  float local_608;
  float fStack_604;
  float fStack_600;
  float fStack_5fc;
  undefined8 *local_5f8;
  undefined8 *local_5f0;
  undefined8 *local_5e8;
  undefined8 *local_5e0;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  undefined8 *local_5c8;
  undefined8 *local_5c0;
  undefined8 *local_5b8;
  undefined8 *local_5b0;
  undefined8 *local_5a8;
  undefined8 *local_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 *local_580;
  undefined8 *local_578;
  undefined8 *local_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 *local_550;
  undefined8 *local_548;
  undefined8 *local_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 *local_520;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 *local_4b0;
  undefined8 *local_4a8;
  undefined8 *local_4a0;
  undefined8 *local_498;
  undefined8 *local_490;
  undefined8 *local_488;
  undefined8 *local_480;
  undefined8 *local_478;
  undefined8 *local_470;
  undefined8 *local_468;
  undefined8 *local_460;
  undefined8 *local_458;
  undefined8 *local_450;
  undefined8 *local_448;
  undefined8 *local_440;
  undefined8 *local_438;
  undefined8 *local_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 *local_410;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 *local_3e0;
  undefined8 *local_3d8;
  undefined8 *local_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 *local_3b0;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 *local_380;
  undefined8 *local_378;
  undefined8 *local_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 *local_350;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 *local_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [16];
  undefined4 local_19c;
  undefined1 local_198 [16];
  float local_17c;
  ulong local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  ulong local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  float local_c8;
  ulong local_b8;
  undefined8 uStack_b0;
  undefined8 local_98;
  undefined8 uStack_90;
  ulong local_88;
  undefined8 uStack_80;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  
  local_c08 = in_RSI;
  local_c00 = in_RCX;
  local_bf8 = in_RDX;
  Light_EvalRes::Light_EvalRes(in_RDI);
  local_a50 = &local_c18;
  local_a54 = 0;
  local_48 = 0;
  local_58 = 0;
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  local_c18 = 0;
  uStack_c10 = 0;
  local_b00 = &local_c18;
  *(undefined8 *)&(in_RDI->value).field_0 = 0;
  *(undefined8 *)((long)&(in_RDI->value).field_0 + 8) = 0;
  local_af0 = &inf;
  fVar11 = std::numeric_limits<float>::infinity();
  in_RDI->dist = fVar11;
  in_RDI->pdf = 0.0;
  if (0.0 < *(float *)(local_c08 + 0x30)) {
    local_bd8 = (undefined8 *)(local_c08 + 0x10);
    local_be0 = (undefined8 *)(local_bf8 + 0x20);
    local_bd0 = &local_c28;
    uVar1 = *local_bd8;
    uVar2 = *(undefined8 *)(local_c08 + 0x18);
    uVar3 = *local_be0;
    uVar4 = *(undefined8 *)(local_bf8 + 0x28);
    local_a38._0_4_ = (float)uVar1;
    local_a38._4_4_ = (float)((ulong)uVar1 >> 0x20);
    uStack_a30._0_4_ = (float)uVar2;
    uStack_a30._4_4_ = (float)((ulong)uVar2 >> 0x20);
    local_a48._0_4_ = (float)uVar3;
    local_a48._4_4_ = (float)((ulong)uVar3 >> 0x20);
    uStack_a40._0_4_ = (float)uVar4;
    uStack_a40._4_4_ = (float)((ulong)uVar4 >> 0x20);
    local_a28 = (float)local_a38 - (float)local_a48;
    fStack_a24 = local_a38._4_4_ - local_a48._4_4_;
    fStack_a20 = (float)uStack_a30 - (float)uStack_a40;
    fStack_a1c = uStack_a30._4_4_ - uStack_a40._4_4_;
    local_258 = CONCAT44(fStack_a24,local_a28);
    uStack_250 = CONCAT44(fStack_a1c,fStack_a20);
    local_b70 = local_c00;
    local_b78 = local_c00;
    local_9b0 = &local_b88;
    local_888 = local_c00;
    local_890 = local_c00;
    uVar5 = *local_c00;
    uVar6 = local_c00[1];
    uVar7 = *local_c00;
    uVar8 = local_c00[1];
    local_208._0_4_ = (float)uVar5;
    local_208._4_4_ = (float)((ulong)uVar5 >> 0x20);
    uStack_200._0_4_ = (float)uVar6;
    uStack_200._4_4_ = (float)((ulong)uVar6 >> 0x20);
    local_218._0_4_ = (float)uVar7;
    local_218._4_4_ = (float)((ulong)uVar7 >> 0x20);
    uStack_210._0_4_ = (float)uVar8;
    uStack_210._4_4_ = (float)((ulong)uVar8 >> 0x20);
    local_878 = (float)local_208 * (float)local_218;
    fStack_874 = local_208._4_4_ * local_218._4_4_;
    fStack_870 = (float)uStack_200 * (float)uStack_210;
    fStack_86c = uStack_200._4_4_ * uStack_210._4_4_;
    local_7b8 = CONCAT44(fStack_874,local_878);
    uStack_7b0 = CONCAT44(fStack_86c,fStack_870);
    local_7a0 = &local_9c8;
    local_770 = &local_9d8;
    local_598 = CONCAT44(fStack_874,fStack_874);
    uStack_590 = CONCAT44(fStack_874,fStack_874);
    local_740 = &local_9e8;
    local_428 = CONCAT44(fStack_870,fStack_870);
    uStack_420 = CONCAT44(fStack_870,fStack_870);
    local_618 = &local_a08;
    local_5d8 = local_878 + fStack_874;
    fStack_5d4 = fStack_874 + fStack_874;
    fStack_5d0 = fStack_870 + fStack_874;
    fStack_5cc = fStack_86c + fStack_874;
    local_2e8 = CONCAT44(fStack_5d4,local_5d8);
    uStack_2e0 = CONCAT44(fStack_5cc,fStack_5d0);
    local_610 = &local_9f8;
    fVar11 = local_5d8 + fStack_870;
    fStack_604 = fStack_5d4 + fStack_870;
    fStack_600 = fStack_5d0 + fStack_870;
    fStack_5fc = fStack_5cc + fStack_870;
    local_718 = CONCAT44(fStack_604,fVar11);
    uStack_710 = CONCAT44(fStack_5fc,fStack_600);
    local_b90 = local_c00;
    local_950 = &local_ba8;
    local_858 = local_c00;
    uVar9 = *local_c00;
    uVar10 = local_c00[1];
    local_228._0_4_ = (float)uVar9;
    local_228._4_4_ = (float)((ulong)uVar9 >> 0x20);
    uStack_220._0_4_ = (float)uVar10;
    uStack_220._4_4_ = (float)((ulong)uVar10 >> 0x20);
    local_848 = (float)local_228 * local_a28;
    fStack_844 = local_228._4_4_ * fStack_a24;
    fStack_840 = (float)uStack_220 * fStack_a20;
    fStack_83c = uStack_220._4_4_ * fStack_a1c;
    local_7d8 = CONCAT44(fStack_844,local_848);
    uStack_7d0 = CONCAT44(fStack_83c,fStack_840);
    local_7c0 = &local_968;
    local_780 = &local_978;
    local_568 = CONCAT44(fStack_844,fStack_844);
    uStack_560 = CONCAT44(fStack_844,fStack_844);
    local_750 = &local_988;
    local_3c8 = CONCAT44(fStack_840,fStack_840);
    uStack_3c0 = CONCAT44(fStack_840,fStack_840);
    local_678 = &local_9a8;
    local_638 = local_848 + fStack_844;
    fStack_634 = fStack_844 + fStack_844;
    fStack_630 = fStack_840 + fStack_844;
    fStack_62c = fStack_83c + fStack_844;
    local_2a8 = CONCAT44(fStack_634,local_638);
    uStack_2a0 = CONCAT44(fStack_62c,fStack_630);
    local_670 = &local_998;
    local_668 = local_638 + fStack_840;
    fStack_664 = fStack_634 + fStack_840;
    fStack_660 = fStack_630 + fStack_840;
    fStack_65c = fStack_62c + fStack_840;
    local_728 = CONCAT44(fStack_664,local_668);
    uStack_720 = CONCAT44(fStack_65c,fStack_660);
    fVar12 = local_668 + local_668;
    local_8f8 = &local_bc8;
    local_818 = local_a28 * local_a28;
    fStack_814 = fStack_a24 * fStack_a24;
    fStack_810 = fStack_a20 * fStack_a20;
    fStack_80c = fStack_a1c * fStack_a1c;
    local_7f8 = CONCAT44(fStack_814,local_818);
    uStack_7f0 = CONCAT44(fStack_80c,fStack_810);
    local_7e0 = &local_908;
    local_790 = &local_918;
    local_538 = CONCAT44(fStack_814,fStack_814);
    uStack_530 = CONCAT44(fStack_814,fStack_814);
    local_760 = &local_928;
    local_368 = CONCAT44(fStack_810,fStack_810);
    uStack_360 = CONCAT44(fStack_810,fStack_810);
    local_6d8 = &local_948;
    local_698 = local_818 + fStack_814;
    fStack_694 = fStack_814 + fStack_814;
    fStack_690 = fStack_810 + fStack_814;
    fStack_68c = fStack_80c + fStack_814;
    local_268 = CONCAT44(fStack_694,local_698);
    uStack_260 = CONCAT44(fStack_68c,fStack_690);
    local_6d0 = &local_938;
    fVar13 = local_698 + fStack_810;
    fStack_6c4 = fStack_694 + fStack_810;
    fStack_6c0 = fStack_690 + fStack_810;
    fStack_6bc = fStack_68c + fStack_810;
    local_738 = CONCAT44(fStack_6c4,fVar13);
    uStack_730 = CONCAT44(fStack_6bc,fStack_6c0);
    local_ad8 = *(float *)(local_c08 + 0x30);
    fVar14 = -(fVar11 * 4.0) * (fVar13 - local_ad8 * local_ad8) + fVar12 * fVar12;
    if (0.0 < fVar14) {
      local_bb8 = local_bd0;
      local_bb0 = local_bd0;
      local_b98 = local_bd0;
      local_adc = fVar12;
      local_acc = fVar14;
      local_a48 = uVar3;
      uStack_a40 = uVar4;
      local_a38 = uVar1;
      uStack_a30 = uVar2;
      local_a10 = local_bd0;
      local_880 = local_9b0;
      local_868 = local_9b0;
      local_860 = local_bd0;
      local_850 = local_950;
      local_838 = local_950;
      local_830 = local_bd0;
      local_828 = local_bd0;
      local_820 = local_8f8;
      local_800 = local_8f8;
      local_798 = local_7e0;
      local_788 = local_7c0;
      local_778 = local_7a0;
      local_768 = local_7e0;
      local_758 = local_7c0;
      local_748 = local_7a0;
      local_6e0 = local_760;
      local_6c8 = fVar13;
      local_6b8 = local_6d0;
      local_6b0 = local_790;
      local_6a8 = local_7e0;
      local_6a0 = local_6d8;
      local_688 = local_6d8;
      local_680 = local_750;
      local_658 = local_670;
      local_650 = local_780;
      local_648 = local_7c0;
      local_640 = local_678;
      local_628 = local_678;
      local_620 = local_740;
      local_608 = fVar11;
      local_5f8 = local_610;
      local_5f0 = local_770;
      local_5e8 = local_7a0;
      local_5e0 = local_618;
      local_5c8 = local_618;
      local_5c0 = local_6d0;
      local_5b8 = local_670;
      local_5b0 = local_610;
      local_5a8 = local_7a0;
      local_5a0 = local_770;
      local_580 = local_770;
      local_578 = local_7c0;
      local_570 = local_780;
      local_550 = local_780;
      local_548 = local_7e0;
      local_540 = local_790;
      local_520 = local_790;
      local_518 = fStack_814;
      fStack_514 = fStack_814;
      fStack_510 = fStack_814;
      fStack_50c = fStack_814;
      local_508 = fStack_844;
      fStack_504 = fStack_844;
      fStack_500 = fStack_844;
      fStack_4fc = fStack_844;
      local_4f8 = fStack_874;
      fStack_4f4 = fStack_874;
      fStack_4f0 = fStack_874;
      fStack_4ec = fStack_874;
      local_4e8 = local_7f8;
      uStack_4e0 = uStack_7f0;
      local_4d8 = local_7d8;
      uStack_4d0 = uStack_7d0;
      local_4c8 = local_7b8;
      uStack_4c0 = uStack_7b0;
      local_4b0 = local_7e0;
      local_4a8 = local_7c0;
      local_4a0 = local_7a0;
      local_498 = local_770;
      local_490 = local_7a0;
      local_488 = local_740;
      local_480 = local_618;
      local_478 = local_780;
      local_470 = local_7c0;
      local_468 = local_750;
      local_460 = local_678;
      local_458 = local_790;
      local_450 = local_7e0;
      local_448 = local_760;
      local_440 = local_6d8;
      local_438 = local_7a0;
      local_430 = local_740;
      local_410 = local_740;
      local_408 = fStack_870;
      fStack_404 = fStack_870;
      fStack_400 = fStack_870;
      fStack_3fc = fStack_870;
      local_3f8 = local_7b8;
      uStack_3f0 = uStack_7b0;
      local_3e0 = local_7a0;
      local_3d8 = local_7c0;
      local_3d0 = local_750;
      local_3b0 = local_750;
      local_3a8 = fStack_840;
      fStack_3a4 = fStack_840;
      fStack_3a0 = fStack_840;
      fStack_39c = fStack_840;
      local_398 = local_7d8;
      uStack_390 = uStack_7d0;
      local_380 = local_7c0;
      local_378 = local_7e0;
      local_370 = local_760;
      local_350 = local_760;
      local_348 = fStack_810;
      fStack_344 = fStack_810;
      fStack_340 = fStack_810;
      fStack_33c = fStack_810;
      local_338 = local_7f8;
      uStack_330 = uStack_7f0;
      local_320 = local_7e0;
      local_318 = local_598;
      uStack_310 = uStack_590;
      local_308 = local_7b8;
      uStack_300 = uStack_7b0;
      local_2f8 = local_428;
      uStack_2f0 = uStack_420;
      local_2d8 = local_568;
      uStack_2d0 = uStack_560;
      local_2c8 = local_7d8;
      uStack_2c0 = uStack_7d0;
      local_2b8 = local_3c8;
      uStack_2b0 = uStack_3c0;
      local_298 = local_538;
      uStack_290 = uStack_530;
      local_288 = local_7f8;
      uStack_280 = uStack_7f0;
      local_278 = local_368;
      uStack_270 = uStack_360;
      local_248 = local_258;
      uStack_240 = uStack_250;
      local_238 = local_258;
      uStack_230 = uStack_250;
      local_228 = uVar9;
      uStack_220 = uVar10;
      local_218 = uVar7;
      uStack_210 = uVar8;
      local_208 = uVar5;
      uStack_200 = uVar6;
      local_c28 = local_258;
      uStack_c20 = uStack_250;
      local_bc8 = local_7f8;
      uStack_bc0 = uStack_7f0;
      local_ba8 = local_7d8;
      uStack_ba0 = uStack_7d0;
      local_b88 = local_7b8;
      uStack_b80 = uStack_7b0;
      local_a08 = local_2e8;
      uStack_a00 = uStack_2e0;
      local_9f8 = local_718;
      uStack_9f0 = uStack_710;
      local_9e8 = local_428;
      uStack_9e0 = uStack_420;
      local_9d8 = local_598;
      uStack_9d0 = uStack_590;
      local_9c8 = local_7b8;
      uStack_9c0 = uStack_7b0;
      local_9a8 = local_2a8;
      uStack_9a0 = uStack_2a0;
      local_998 = local_728;
      uStack_990 = uStack_720;
      local_988 = local_3c8;
      uStack_980 = uStack_3c0;
      local_978 = local_568;
      uStack_970 = uStack_560;
      local_968 = local_7d8;
      uStack_960 = uStack_7d0;
      local_948 = local_268;
      uStack_940 = uStack_260;
      local_938 = local_738;
      uStack_930 = uStack_730;
      local_928 = local_368;
      uStack_920 = uStack_360;
      local_918 = local_538;
      uStack_910 = uStack_530;
      local_908 = local_7f8;
      uStack_900 = uStack_7f0;
      fVar15 = sqrtf(fVar14);
      fVar15 = (fVar12 - fVar15) / (fVar11 * 2.0);
      local_ad0 = fVar14;
      fVar14 = sqrtf(fVar14);
      if (0.0 < (fVar12 + fVar14) / (fVar11 * 2.0)) {
        in_RDI->dist = fVar15;
        local_ae0 = *(float *)(local_c08 + 0x30);
        local_198._4_4_ = 0;
        local_198._0_4_ = fVar13;
        local_a88 = local_198._0_8_;
        uStack_a80 = 0;
        local_b8 = local_198._0_8_;
        uStack_b0 = 0;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = local_198._0_8_;
        local_a98 = rcpss(auVar16,auVar16);
        local_19c = 0x40000000;
        local_1b8 = ZEXT416(0x40000000);
        local_118 = local_198._0_8_;
        uStack_110 = 0;
        local_108._0_4_ = local_a98._0_4_;
        fVar11 = (float)local_108;
        local_108._4_4_ = local_a98._4_4_;
        local_108._0_4_ = (float)local_108 * fVar13;
        uStack_700 = local_a98._8_8_;
        local_98 = local_108;
        fVar12 = 2.0 - (float)local_108;
        local_88 = (ulong)(uint)fVar12;
        uStack_80 = 0;
        local_138 = local_88;
        uStack_130 = 0;
        fVar11 = fVar11 * fVar12;
        local_128 = CONCAT44(local_108._4_4_,fVar11);
        local_708 = local_128;
        local_ad4 = 1.0 - local_ae0 * local_ae0 * fVar11;
        local_a78 = fVar13;
        local_198 = ZEXT416((uint)fVar13);
        local_17c = fVar13;
        uStack_120 = uStack_700;
        uStack_100 = uStack_700;
        uStack_90 = uStack_700;
        fVar11 = sqrtf(local_ad4);
        fVar11 = uniformSampleConePDF(fVar11);
        in_RDI->pdf = fVar11;
        auVar16 = rcpss(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
        local_c8 = auVar16._0_4_;
        local_c8 = local_c8 * (2.0 - local_c8 * fVar15);
        fVar11 = in_RDI->pdf;
        local_1c8 = (float)*(undefined8 *)(local_c08 + 0x20);
        fStack_1c4 = (float)((ulong)*(undefined8 *)(local_c08 + 0x20) >> 0x20);
        fStack_1c0 = (float)*(undefined8 *)(local_c08 + 0x28);
        fStack_1bc = (float)((ulong)*(undefined8 *)(local_c08 + 0x28) >> 0x20);
        local_c8 = local_c8 * local_c8;
        *(ulong *)&(in_RDI->value).field_0 =
             CONCAT44(fStack_1c4 * fVar11 * local_c8,local_1c8 * fVar11 * local_c8);
        *(ulong *)((long)&(in_RDI->value).field_0 + 8) =
             CONCAT44(fStack_1bc * fVar11 * local_c8,fStack_1c0 * fVar11 * local_c8);
      }
    }
  }
  return in_RDI;
}

Assistant:

SYCL_EXTERNAL Light_EvalRes PointLight_eval(const Light* super,
                                                           const DifferentialGeometry& dg,
                                                           const Vec3fa& dir)
{
  const PointLight* self = (PointLight*)super;
  Light_EvalRes res;
  res.value = Vec3fa(0.f);
  res.dist = inf;
  res.pdf = 0.f;

  if (self->radius > 0.f) {
    const Vec3fa A = self->position - dg.P;
    const float a = dot(dir, dir);
    const float b = 2.f * dot(dir, A);
    const float centerDist2 = dot(A, A);
    const float c = centerDist2 - sqr(self->radius);
    const float radical = sqr(b) - 4.f*a*c;

    if (radical > 0.f) {
      const float t_near = (b - sqrt(radical)) / (2.f*a);
      const float t_far = (b + sqrt(radical)) / (2.f*a);

      if (t_far > 0.0f) {
        // TODO: handle interior case
        res.dist = t_near;
        const float sinTheta2 = sqr(self->radius) * rcp(centerDist2);
        const float cosTheta = sqrt(1.f - sinTheta2);
        res.pdf = uniformSampleConePDF(cosTheta);
        const float invdist = rcp(t_near);
        res.value = self->power * res.pdf * sqr(invdist);
      }
    }
  }

  return res;
}